

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TDefaultGlslIoResolver::beginResolve(TDefaultGlslIoResolver *this,EShLanguage stage)

{
  EShLanguage stage_local;
  TDefaultGlslIoResolver *this_local;
  
  if (stage == EShLangCount) {
    this->currentStage = EShLangCount;
    this->preStage = EShLangCount;
  }
  else if (this->currentStage != stage) {
    this->preStage = this->currentStage;
    this->currentStage = stage;
  }
  return;
}

Assistant:

void TDefaultGlslIoResolver::beginResolve(EShLanguage stage) {
    // reset stage state
    if (stage == EShLangCount)
        preStage = currentStage = stage;
    // update stage state
    else if (currentStage != stage) {
        preStage = currentStage;
        currentStage = stage;
    }
}